

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

void moira::sprintd_signed(char **s,i64 value)

{
  char *pcVar1;
  int digits;
  
  if (value < 0) {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    *pcVar1 = '-';
    value = -value;
  }
  digits = decDigits(value);
  sprintd(s,value,digits);
  return;
}

Assistant:

static void sprintd_signed(char *&s, i64 value)
{
    if (value < 0) { *s++ = '-'; value *= -1; }
    sprintd(s, value, decDigits(value));
}